

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
* __thiscall
spirv_cross::CompilerGLSL::flattened_access_chain_offset_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
           *__return_storage_ptr__,CompilerGLSL *this,SPIRType *basetype,uint32_t *indices,
          uint32_t count,uint32_t offset,uint32_t word_stride,bool *need_transpose,
          uint32_t *out_matrix_stride,uint32_t *out_array_stride,bool ptr_chain)

{
  bool bVar1;
  uint32_t uVar2;
  CompilerError *pCVar3;
  ulong uVar4;
  size_t sVar5;
  TypedID *this_00;
  uint local_318;
  uint local_314;
  uint local_2e8;
  uint local_2e4;
  uint32_t local_24c;
  uint32_t local_248;
  byte local_241;
  uint local_224;
  string local_220;
  string local_200;
  uint local_1dc;
  SPIRConstant *pSStack_1d8;
  uint32_t indexing_stride_1;
  SPIRConstant *constant_3;
  string local_1c8;
  string local_1a8;
  uint local_184;
  SPIRConstant *pSStack_180;
  uint32_t indexing_stride;
  SPIRConstant *constant_2;
  SPIRType *local_138;
  SPIRType *struct_type;
  uint32_t local_128;
  uint local_124;
  uint32_t parent_type;
  string local_100;
  SPIRConstant *local_e0;
  SPIRConstant *constant_1;
  string local_d0;
  string local_b0;
  SPIRConstant *local_90;
  SPIRConstant *constant;
  uint32_t local_78;
  uint32_t local_74;
  uint local_70;
  uint32_t index;
  uint32_t i;
  uint32_t array_stride;
  uint32_t matrix_stride;
  bool row_major_matrix_needs_conversion;
  string expr;
  SPIRType *type;
  uint32_t local_30;
  uint32_t uStack_2c;
  bool ptr_chain_local;
  uint32_t offset_local;
  uint32_t count_local;
  uint32_t *indices_local;
  SPIRType *basetype_local;
  CompilerGLSL *this_local;
  
  local_30 = offset;
  uStack_2c = count;
  _offset_local = indices;
  indices_local = (uint32_t *)basetype;
  basetype_local = (SPIRType *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  expr.field_2._8_8_ = Compiler::get_pointee_type(&this->super_Compiler,basetype);
  ::std::__cxx11::string::string((string *)&matrix_stride);
  if (need_transpose == (bool *)0x0) {
    local_241 = 0;
  }
  else {
    local_241 = *need_transpose;
  }
  array_stride._3_1_ = local_241 & 1;
  if (out_matrix_stride == (uint32_t *)0x0) {
    local_248 = 0;
  }
  else {
    local_248 = *out_matrix_stride;
  }
  i = local_248;
  if (out_array_stride == (uint32_t *)0x0) {
    local_24c = 0;
  }
  else {
    local_24c = *out_array_stride;
  }
  index = local_24c;
  local_70 = 0;
  do {
    if (uStack_2c <= local_70) {
      if (need_transpose != (bool *)0x0) {
        *need_transpose = (bool)(array_stride._3_1_ & 1);
      }
      if (out_matrix_stride != (uint32_t *)0x0) {
        *out_matrix_stride = i;
      }
      if (out_array_stride != (uint32_t *)0x0) {
        *out_array_stride = index;
      }
      ::std::make_pair<std::__cxx11::string&,unsigned_int&>
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&matrix_stride
                 ,&local_30);
      ::std::__cxx11::string::~string((string *)&matrix_stride);
      return __return_storage_ptr__;
    }
    local_74 = _offset_local[local_70];
    if ((ptr_chain) && (local_70 == 0)) {
      local_78 = indices_local[2];
      index = Compiler::get_decoration(&this->super_Compiler,(ID)local_78,DecorationArrayStride);
      if (index == 0) {
        pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar3,"SPIR-V does not define ArrayStride for buffer block.");
        __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      local_90 = Compiler::maybe_get<spirv_cross::SPIRConstant>(&this->super_Compiler,local_74);
      if (local_90 == (SPIRConstant *)0x0) {
        if (index % word_stride != 0) {
          pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar3,
                     "Array stride for dynamic indexing must be divisible by the size of a 4-component vector. Likely culprit here is a float or vec2 array inside a push constant block which is std430. This cannot be flattened. Try using std140 layout instead."
                    );
          __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        to_enclosed_expression_abi_cxx11_(&local_b0,this,local_74,true);
        ::std::__cxx11::string::operator+=((string *)&matrix_stride,(string *)&local_b0);
        ::std::__cxx11::string::~string((string *)&local_b0);
        ::std::__cxx11::string::operator+=((string *)&matrix_stride," * ");
        constant_1._4_4_ = index / word_stride;
        convert_to_string<unsigned_int,_0>(&local_d0,(uint *)((long)&constant_1 + 4));
        ::std::__cxx11::string::operator+=((string *)&matrix_stride,(string *)&local_d0);
        ::std::__cxx11::string::~string((string *)&local_d0);
        ::std::__cxx11::string::operator+=((string *)&matrix_stride," + ");
      }
      else {
        uVar2 = SPIRConstant::scalar(local_90,0,0);
        local_30 = uVar2 * index + local_30;
      }
    }
    else {
      bVar1 = VectorView<unsigned_int>::empty
                        ((VectorView<unsigned_int> *)(expr.field_2._8_8_ + 0x20));
      if (bVar1) {
        if (*(int *)(expr.field_2._8_8_ + 0x10) == 0xf) {
          local_74 = Compiler::evaluate_constant_u32(&this->super_Compiler,local_74);
          uVar4 = (ulong)local_74;
          sVar5 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                            ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                             (expr.field_2._8_8_ + 0x88));
          if (sVar5 <= uVar4) {
            pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar3,"Member index is out of bounds!");
            __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          uVar2 = Compiler::type_struct_member_offset
                            (&this->super_Compiler,(SPIRType *)expr.field_2._8_8_,local_74);
          local_30 = local_30 + uVar2;
          local_138 = (SPIRType *)expr.field_2._8_8_;
          this_00 = (TypedID *)
                    VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                              ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                               (expr.field_2._8_8_ + 0x88),(ulong)local_74);
          uVar2 = TypedID::operator_cast_to_unsigned_int(this_00);
          expr.field_2._8_8_ = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
          if (((SPIRType *)expr.field_2._8_8_)->columns < 2) {
            array_stride._3_1_ = 0;
          }
          else {
            i = Compiler::type_struct_member_matrix_stride(&this->super_Compiler,local_138,local_74)
            ;
            Compiler::combined_decoration_for_member
                      ((Bitset *)&constant_2,&this->super_Compiler,local_138,local_74);
            array_stride._3_1_ = Bitset::get((Bitset *)&constant_2,4);
            Bitset::~Bitset((Bitset *)&constant_2);
          }
          bVar1 = VectorView<unsigned_int>::empty
                            ((VectorView<unsigned_int> *)(expr.field_2._8_8_ + 0x20));
          if (!bVar1) {
            index = Compiler::type_struct_member_array_stride
                              (&this->super_Compiler,local_138,local_74);
          }
        }
        else if (*(uint *)(expr.field_2._8_8_ + 0x1c) < 2) {
          if (*(uint *)(expr.field_2._8_8_ + 0x18) < 2) {
            pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar3,"Cannot subdivide a scalar value!");
            __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          pSStack_1d8 = Compiler::maybe_get<spirv_cross::SPIRConstant>
                                  (&this->super_Compiler,local_74);
          if (pSStack_1d8 == (SPIRConstant *)0x0) {
            if ((array_stride._3_1_ & 1) == 0) {
              local_318 = *(uint *)(expr.field_2._8_8_ + 0x14) >> 3;
            }
            else {
              local_318 = i;
            }
            local_1dc = local_318;
            if (local_318 % word_stride != 0) {
              pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError
                        (pCVar3,
                         "Stride for dynamic vector indexing must be divisible by the size of a 4-component vector. This cannot be flattened in legacy targets."
                        );
              __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            to_enclosed_expression_abi_cxx11_(&local_200,this,local_74,false);
            ::std::__cxx11::string::operator+=((string *)&matrix_stride,(string *)&local_200);
            ::std::__cxx11::string::~string((string *)&local_200);
            ::std::__cxx11::string::operator+=((string *)&matrix_stride," * ");
            local_224 = local_1dc / word_stride;
            convert_to_string<unsigned_int,_0>(&local_220,&local_224);
            ::std::__cxx11::string::operator+=((string *)&matrix_stride,(string *)&local_220);
            ::std::__cxx11::string::~string((string *)&local_220);
            ::std::__cxx11::string::operator+=((string *)&matrix_stride," + ");
          }
          else {
            local_74 = Compiler::evaluate_constant_u32(&this->super_Compiler,local_74);
            if ((array_stride._3_1_ & 1) == 0) {
              local_314 = *(uint *)(expr.field_2._8_8_ + 0x14) >> 3;
            }
            else {
              local_314 = i;
            }
            local_30 = local_74 * local_314 + local_30;
          }
          uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)(expr.field_2._8_8_ + 0x114));
          expr.field_2._8_8_ = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
        }
        else {
          pSStack_180 = Compiler::maybe_get<spirv_cross::SPIRConstant>
                                  (&this->super_Compiler,local_74);
          if (pSStack_180 == (SPIRConstant *)0x0) {
            if ((array_stride._3_1_ & 1) == 0) {
              local_2e8 = i;
            }
            else {
              local_2e8 = *(uint *)(expr.field_2._8_8_ + 0x14) >> 3;
            }
            local_184 = local_2e8;
            if (local_2e8 % word_stride != 0) {
              pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError
                        (pCVar3,
                         "Matrix stride for dynamic indexing must be divisible by the size of a 4-component vector. Likely culprit here is a row-major matrix being accessed dynamically. This cannot be flattened. Try using std140 layout instead."
                        );
              __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            to_enclosed_expression_abi_cxx11_(&local_1a8,this,local_74,false);
            ::std::__cxx11::string::operator+=((string *)&matrix_stride,(string *)&local_1a8);
            ::std::__cxx11::string::~string((string *)&local_1a8);
            ::std::__cxx11::string::operator+=((string *)&matrix_stride," * ");
            constant_3._4_4_ = local_184 / word_stride;
            convert_to_string<unsigned_int,_0>(&local_1c8,(uint *)((long)&constant_3 + 4));
            ::std::__cxx11::string::operator+=((string *)&matrix_stride,(string *)&local_1c8);
            ::std::__cxx11::string::~string((string *)&local_1c8);
            ::std::__cxx11::string::operator+=((string *)&matrix_stride," + ");
          }
          else {
            local_74 = Compiler::evaluate_constant_u32(&this->super_Compiler,local_74);
            if ((array_stride._3_1_ & 1) == 0) {
              local_2e4 = i;
            }
            else {
              local_2e4 = *(uint *)(expr.field_2._8_8_ + 0x14) >> 3;
            }
            local_30 = local_74 * local_2e4 + local_30;
          }
          uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)(expr.field_2._8_8_ + 0x114));
          expr.field_2._8_8_ = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
        }
      }
      else {
        local_e0 = Compiler::maybe_get<spirv_cross::SPIRConstant>(&this->super_Compiler,local_74);
        if (local_e0 == (SPIRConstant *)0x0) {
          if (index % word_stride != 0) {
            pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar3,
                       "Array stride for dynamic indexing must be divisible by the size of a 4-component vector. Likely culprit here is a float or vec2 array inside a push constant block which is std430. This cannot be flattened. Try using std140 layout instead."
                      );
            __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          to_enclosed_expression_abi_cxx11_(&local_100,this,local_74,false);
          ::std::__cxx11::string::operator+=((string *)&matrix_stride,(string *)&local_100);
          ::std::__cxx11::string::~string((string *)&local_100);
          ::std::__cxx11::string::operator+=((string *)&matrix_stride," * ");
          local_124 = index / word_stride;
          convert_to_string<unsigned_int,_0>((string *)&parent_type,&local_124);
          ::std::__cxx11::string::operator+=((string *)&matrix_stride,(string *)&parent_type);
          ::std::__cxx11::string::~string((string *)&parent_type);
          ::std::__cxx11::string::operator+=((string *)&matrix_stride," + ");
        }
        else {
          uVar2 = SPIRConstant::scalar(local_e0,0,0);
          local_30 = uVar2 * index + local_30;
        }
        local_128 = TypedID::operator_cast_to_unsigned_int((TypedID *)(expr.field_2._8_8_ + 0x114));
        expr.field_2._8_8_ = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,local_128);
        bVar1 = VectorView<unsigned_int>::empty
                          (&(((SPIRType *)expr.field_2._8_8_)->array).super_VectorView<unsigned_int>
                          );
        if (!bVar1) {
          TypedID<(spirv_cross::Types)0>::TypedID
                    ((TypedID<(spirv_cross::Types)0> *)((long)&struct_type + 4),local_128);
          index = Compiler::get_decoration
                            (&this->super_Compiler,struct_type._4_4_,DecorationArrayStride);
        }
      }
    }
    local_70 = local_70 + 1;
  } while( true );
}

Assistant:

std::pair<std::string, uint32_t> CompilerGLSL::flattened_access_chain_offset(
    const SPIRType &basetype, const uint32_t *indices, uint32_t count, uint32_t offset, uint32_t word_stride,
    bool *need_transpose, uint32_t *out_matrix_stride, uint32_t *out_array_stride, bool ptr_chain)
{
	// Start traversing type hierarchy at the proper non-pointer types.
	const auto *type = &get_pointee_type(basetype);

	std::string expr;

	// Inherit matrix information in case we are access chaining a vector which might have come from a row major layout.
	bool row_major_matrix_needs_conversion = need_transpose ? *need_transpose : false;
	uint32_t matrix_stride = out_matrix_stride ? *out_matrix_stride : 0;
	uint32_t array_stride = out_array_stride ? *out_array_stride : 0;

	for (uint32_t i = 0; i < count; i++)
	{
		uint32_t index = indices[i];

		// Pointers
		if (ptr_chain && i == 0)
		{
			// Here, the pointer type will be decorated with an array stride.
			array_stride = get_decoration(basetype.self, DecorationArrayStride);
			if (!array_stride)
				SPIRV_CROSS_THROW("SPIR-V does not define ArrayStride for buffer block.");

			auto *constant = maybe_get<SPIRConstant>(index);
			if (constant)
			{
				// Constant array access.
				offset += constant->scalar() * array_stride;
			}
			else
			{
				// Dynamic array access.
				if (array_stride % word_stride)
				{
					SPIRV_CROSS_THROW("Array stride for dynamic indexing must be divisible by the size "
					                  "of a 4-component vector. "
					                  "Likely culprit here is a float or vec2 array inside a push "
					                  "constant block which is std430. "
					                  "This cannot be flattened. Try using std140 layout instead.");
				}

				expr += to_enclosed_expression(index);
				expr += " * ";
				expr += convert_to_string(array_stride / word_stride);
				expr += " + ";
			}
		}
		// Arrays
		else if (!type->array.empty())
		{
			auto *constant = maybe_get<SPIRConstant>(index);
			if (constant)
			{
				// Constant array access.
				offset += constant->scalar() * array_stride;
			}
			else
			{
				// Dynamic array access.
				if (array_stride % word_stride)
				{
					SPIRV_CROSS_THROW("Array stride for dynamic indexing must be divisible by the size "
					                  "of a 4-component vector. "
					                  "Likely culprit here is a float or vec2 array inside a push "
					                  "constant block which is std430. "
					                  "This cannot be flattened. Try using std140 layout instead.");
				}

				expr += to_enclosed_expression(index, false);
				expr += " * ";
				expr += convert_to_string(array_stride / word_stride);
				expr += " + ";
			}

			uint32_t parent_type = type->parent_type;
			type = &get<SPIRType>(parent_type);

			if (!type->array.empty())
				array_stride = get_decoration(parent_type, DecorationArrayStride);
		}
		// For structs, the index refers to a constant, which indexes into the members.
		// We also check if this member is a builtin, since we then replace the entire expression with the builtin one.
		else if (type->basetype == SPIRType::Struct)
		{
			index = evaluate_constant_u32(index);

			if (index >= type->member_types.size())
				SPIRV_CROSS_THROW("Member index is out of bounds!");

			offset += type_struct_member_offset(*type, index);

			auto &struct_type = *type;
			type = &get<SPIRType>(type->member_types[index]);

			if (type->columns > 1)
			{
				matrix_stride = type_struct_member_matrix_stride(struct_type, index);
				row_major_matrix_needs_conversion =
				    combined_decoration_for_member(struct_type, index).get(DecorationRowMajor);
			}
			else
				row_major_matrix_needs_conversion = false;

			if (!type->array.empty())
				array_stride = type_struct_member_array_stride(struct_type, index);
		}
		// Matrix -> Vector
		else if (type->columns > 1)
		{
			auto *constant = maybe_get<SPIRConstant>(index);
			if (constant)
			{
				index = evaluate_constant_u32(index);
				offset += index * (row_major_matrix_needs_conversion ? (type->width / 8) : matrix_stride);
			}
			else
			{
				uint32_t indexing_stride = row_major_matrix_needs_conversion ? (type->width / 8) : matrix_stride;
				// Dynamic array access.
				if (indexing_stride % word_stride)
				{
					SPIRV_CROSS_THROW("Matrix stride for dynamic indexing must be divisible by the size of a "
					                  "4-component vector. "
					                  "Likely culprit here is a row-major matrix being accessed dynamically. "
					                  "This cannot be flattened. Try using std140 layout instead.");
				}

				expr += to_enclosed_expression(index, false);
				expr += " * ";
				expr += convert_to_string(indexing_stride / word_stride);
				expr += " + ";
			}

			type = &get<SPIRType>(type->parent_type);
		}
		// Vector -> Scalar
		else if (type->vecsize > 1)
		{
			auto *constant = maybe_get<SPIRConstant>(index);
			if (constant)
			{
				index = evaluate_constant_u32(index);
				offset += index * (row_major_matrix_needs_conversion ? matrix_stride : (type->width / 8));
			}
			else
			{
				uint32_t indexing_stride = row_major_matrix_needs_conversion ? matrix_stride : (type->width / 8);

				// Dynamic array access.
				if (indexing_stride % word_stride)
				{
					SPIRV_CROSS_THROW("Stride for dynamic vector indexing must be divisible by the "
					                  "size of a 4-component vector. "
					                  "This cannot be flattened in legacy targets.");
				}

				expr += to_enclosed_expression(index, false);
				expr += " * ";
				expr += convert_to_string(indexing_stride / word_stride);
				expr += " + ";
			}

			type = &get<SPIRType>(type->parent_type);
		}
		else
			SPIRV_CROSS_THROW("Cannot subdivide a scalar value!");
	}

	if (need_transpose)
		*need_transpose = row_major_matrix_needs_conversion;
	if (out_matrix_stride)
		*out_matrix_stride = matrix_stride;
	if (out_array_stride)
		*out_array_stride = array_stride;

	return std::make_pair(expr, offset);
}